

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O3

int __thiscall MeCab::CharProperty::open(CharProperty *this,char *__file,int __oflag,...)

{
  pointer *pppcVar1;
  Mmap<char> *pMVar2;
  int *piVar3;
  pointer ppcVar4;
  iterator __position;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  whatlog *pwVar8;
  char *r;
  CharInfo *pCVar9;
  char *s;
  ostringstream error;
  CharInfo *local_1a8;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  iVar5 = Mmap<char>::open((this->cmmap_).ptr_,__file,0x15cd2b);
  if ((char)iVar5 == '\0') {
    pwVar8 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar8,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)pwVar8,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"cmmap_->open(filename, \"r\")",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
  }
  else {
    pMVar2 = (this->cmmap_).ptr_;
    piVar3 = (int *)pMVar2->text;
    iVar5 = *piVar3;
    if ((ulong)(uint)(iVar5 << 5) + 0x40000 == pMVar2->length) {
      ppcVar4 = (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppcVar4) {
        (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppcVar4;
      }
      pCVar9 = (CharInfo *)(piVar3 + 1);
      if (iVar5 != 0) {
        do {
          __position._M_current =
               (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_1a8 = pCVar9;
          if (__position._M_current ==
              (this->clist_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&this->clist_,__position,
                       (char **)&local_1a8);
          }
          else {
            *__position._M_current = (char *)pCVar9;
            pppcVar1 = &(this->clist_).
                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
          pCVar9 = pCVar9 + 8;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      this->map_ = pCVar9;
      iVar5 = (int)CONCAT71((int7)((ulong)this >> 8),1);
      goto LAB_0012feb4;
    }
    pwVar8 = &this->what_;
    std::ios::clear((int)*(undefined8 *)(*(long *)&this->what_ + -0x18) + (int)pwVar8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pwVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pwVar8,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)pwVar8,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"fsize == cmmap_->size()",0x17);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"invalid file size: ",0x13);
    if (__file == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(__file);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,__file,sVar7);
    }
  }
  iVar5 = 0;
LAB_0012feb4:
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return iVar5;
}

Assistant:

bool CharProperty::open(const char *filename) {
  std::ostringstream error;
  CHECK_FALSE(cmmap_->open(filename, "r"));

  const char *ptr = cmmap_->begin();
  unsigned int csize;
  read_static<unsigned int>(&ptr, csize);

  size_t fsize = sizeof(unsigned int) +
      (32 * csize) + sizeof(unsigned int) * 0xffff;

  CHECK_FALSE(fsize == cmmap_->size())
      << "invalid file size: " << filename;

  clist_.clear();
  for (unsigned int i = 0; i < csize; ++i) {
    const char *s = read_ptr(&ptr, 32);
    clist_.push_back(s);
  }

  map_ = reinterpret_cast<const CharInfo *>(ptr);

  return true;
}